

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void cpu_stw_data_ra_mipsel
               (CPUArchState_conflict8 *env,target_ulong_conflict ptr,uint32_t val,uintptr_t retaddr
               )

{
  TCGMemOpIdx oi;
  
  oi = 0x13;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x10;
  }
  store_helper(env,ptr,(ulong)val,oi,retaddr,MO_16);
  return;
}

Assistant:

void cpu_stw_data_ra(CPUArchState *env, target_ulong ptr,
                     uint32_t val, uintptr_t retaddr)
{
    cpu_stw_mmuidx_ra(env, ptr, val, cpu_mmu_index(env, false), retaddr);
}